

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveModel.cpp
# Opt level: O2

void __thiscall WaveModel::setDataFromString(WaveModel *this,QString *str)

{
  Waveform *this_00;
  PermanentEditor ctx;
  string local_50;
  PermanentEditor local_30;
  
  Module::permanentEdit(&local_30,(this->super_GraphModel).mModule);
  this_00 = this->mWaveform;
  QString::toStdString_abi_cxx11_(&local_50,str);
  trackerboy::Waveform::fromString(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Module::PermanentEditor::~PermanentEditor(&local_30);
  GraphModel::dataChanged(&this->super_GraphModel);
  return;
}

Assistant:

void WaveModel::setDataFromString(QString const& str) {
 
    {
        auto ctx = mModule.permanentEdit();
        mWaveform->fromString(str.toStdString());
    }
    emit dataChanged();
}